

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

void __thiscall
RootIndexProxyModelPrivate::onLayoutChanged
          (RootIndexProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QModelIndex *pQVar1;
  QModelIndex *pQVar2;
  QModelIndex childIdx;
  QList<QPersistentModelIndex> *pQVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  RootIndexProxyModelPrivate *this_00;
  long lVar8;
  QPersistentModelIndex *this_01;
  long lVar9;
  QList<QPersistentModelIndex> parents;
  QModelIndex mappedParent;
  QArrayDataPointer<QPersistentModelIndex> local_a8;
  QModelIndex *local_90;
  QList<QPersistentModelIndex> *local_88;
  RootIndexProxyModelPrivate *local_80;
  QModelIndex local_78;
  QModelIndex local_60;
  QModelIndex local_48;
  
  pQVar1 = (QModelIndex *)this->q_ptr;
  local_88 = sourceParents;
  if (0 < (this->proxyIndexes).d.size) {
    lVar7 = 0;
    lVar9 = 0;
    lVar8 = 0;
    local_80 = this;
    do {
      pQVar2 = (local_80->proxyIndexes).d.ptr;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_60,
                 (QPersistentModelIndex *)
                 ((long)&((local_80->layoutChangePersistentIndexes).d.ptr)->d + lVar9));
      (**(code **)(*(long *)pQVar1 + 0x198))(&local_a8,pQVar1,&local_60);
      QAbstractItemModel::changePersistentIndex(pQVar1,(QModelIndex *)((long)&pQVar2->r + lVar7));
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 8;
      lVar7 = lVar7 + 0x18;
      this = local_80;
    } while (lVar8 < (local_80->proxyIndexes).d.size);
  }
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  QList<QModelIndex>::clear(&this->proxyIndexes);
  pQVar3 = local_88;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QPersistentModelIndex *)0x0;
  local_a8.size = 0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_a8,(local_88->d).size);
  lVar7 = (pQVar3->d).size;
  local_90 = pQVar1;
  if (lVar7 != 0) {
    this_01 = (pQVar3->d).ptr;
    lVar7 = lVar7 << 3;
    bVar6 = false;
    do {
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 == '\0') {
LAB_0013cacb:
        if (!bVar6) {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_60);
          QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                    ((QMovableArrayOps<QPersistentModelIndex> *)&local_a8,local_a8.size,
                     (QPersistentModelIndex *)&local_60);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_60);
          bVar6 = true;
        }
      }
      else {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&this->m_rootIndex);
        this_00 = (RootIndexProxyModelPrivate *)&local_60;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,this_01);
        childIdx.i = local_78.i;
        childIdx.r = local_78.r;
        childIdx.c = local_78.c;
        childIdx.m = local_78.m;
        bVar5 = isDescendant(this_00,childIdx,&local_60);
        if (bVar5) goto LAB_0013cacb;
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,this_01);
        (**(code **)(*(long *)local_90 + 0x198))
                  ((RootIndexProxyModelPrivate *)&local_60,local_90,&local_48);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_48,&local_60);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_a8,local_a8.size,
                   (QPersistentModelIndex *)&local_48);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_48);
      }
      this_01 = this_01 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  QAbstractItemModel::layoutChanged((QList *)local_90,(LayoutChangeHint)&local_a8);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_a8);
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(RootIndexProxyModel);
    for (int i = 0; i < proxyIndexes.size(); ++i)
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();
    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    bool addedInvalidIndex = false;
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid() || isDescendant(m_rootIndex, parent)) {
            if (!addedInvalidIndex) {
                addedInvalidIndex = true;
                parents << QPersistentModelIndex();
            }
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }
    q->layoutChanged(parents, hint);
}